

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroupStamp.cpp
# Opt level: O1

void __thiscall OpenMD::CutoffGroupStamp::CutoffGroupStamp(CutoffGroupStamp *this)

{
  _Rb_tree_header *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__CutoffGroupStamp_002ffee8;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->members_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"nMembers","");
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_DataHolder).deprecatedKeywords_,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

CutoffGroupStamp::CutoffGroupStamp() {
    deprecatedKeywords_.insert("nMembers");
  }